

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

QVariant * __thiscall QMYSQLResult::data(QMYSQLResult *this,int field)

{
  int *piVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  QMYSQLResultPrivate *pQVar8;
  ulong uVar9;
  qsizetype qVar10;
  long lVar11;
  const_reference f_00;
  qint64 qVar12;
  quint64 qVar13;
  longlong lVar14;
  QVariant *other;
  QVariant *this_00;
  uint in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  double dbl;
  QT_MYSQL_TIME *t;
  QMyField *f;
  my_ulonglong fieldLength;
  QMYSQLResultPrivate *d;
  QByteArray ba;
  bool ok;
  QTime time;
  QDate date;
  QString val;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QVariant v;
  QVariant variant;
  QLoggingCategory *in_stack_fffffffffffffd38;
  Initialization spec;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  QMessageLogger *in_stack_fffffffffffffd50;
  QVariant *utf8;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  longlong local_270;
  QByteArray local_248;
  QByteArray local_230;
  QByteArray local_218;
  byte local_1f9;
  uint64_t local_1e0;
  QMetaTypeInterface *local_1d8;
  uint local_1b4;
  qint64 local_1b0;
  QTimeZone local_1a8;
  uint local_19c;
  qint64 local_198;
  QDateTime local_190 [12];
  QTime local_184;
  QDate local_180;
  QTime local_174;
  QDate local_170;
  QMetaTypeInterface *local_168;
  uint64_t local_160;
  QMetaTypeInterface *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  char local_138 [32];
  undefined8 local_118;
  ulong local_110;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 uStack_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  utf8 = in_RDI;
  pQVar8 = d_func((QMYSQLResult *)0x10b136);
  uVar9 = QSqlResult::isSelect();
  if ((uVar9 & 1) != 0) {
    in_stack_fffffffffffffd50 = (QMessageLogger *)(long)(int)in_EDX;
    qVar10 = QList<QMYSQLResultPrivate::QMyField>::size(&pQVar8->fields);
    if ((long)in_stack_fffffffffffffd50 < qVar10) {
      lVar11 = QSqlResult::driver();
      if (lVar11 == 0) {
        QVariant::QVariant((QVariant *)0x10b230);
        goto LAB_0010bcb4;
      }
      local_270 = 0;
      f_00 = QList<QMYSQLResultPrivate::QMyField>::at
                       ((QList<QMYSQLResultPrivate::QMyField> *)in_stack_fffffffffffffd40,
                        (qsizetype)in_stack_fffffffffffffd38);
      local_150 = 0xaaaaaaaaaaaaaaaa;
      local_148 = 0xaaaaaaaaaaaaaaaa;
      local_140 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x10b2a2);
      if ((pQVar8->preparedQuery & 1U) == 0) {
        if (pQVar8->row[(int)in_EDX] == (char *)0x0) {
          local_1d8 = (f_00->type).d_ptr;
          QVariant::QVariant(in_RDI,(QMetaType)local_1d8,(void *)0x0);
        }
        else {
          bVar4 = qIsBitfield(f_00->myField->type);
          if (bVar4) {
            local_1e0 = qDecodeBitfield(f_00,pQVar8->row[(int)in_EDX]);
            QVariant::fromValue<unsigned_long,_true>
                      ((unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          }
          else {
            lVar11 = mysql_fetch_lengths(pQVar8->result);
            local_270 = *(longlong *)(lVar11 + (long)(int)in_EDX * 8);
            iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,
                                  (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            if (iVar5 != 0xc) {
              QString::fromUtf8((char *)utf8,(qsizetype)in_RDI);
              QString::operator=((QString *)in_stack_fffffffffffffd40,
                                 (QString *)in_stack_fffffffffffffd38);
              QString::~QString((QString *)0x10b82f);
            }
LAB_0010b831:
            iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,
                                  (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            other = (QVariant *)(ulong)(iVar5 - 2);
            iVar5 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
            switch(other) {
            case (QVariant *)0x0:
            case (QVariant *)0x1f:
            case (QVariant *)0x20:
              iVar5 = QString::toInt((QString *)
                                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                     (bool *)other,iVar5);
              QVariant::QVariant(in_RDI,iVar5);
              break;
            case (QVariant *)0x1:
            case (QVariant *)0x22:
            case (QVariant *)0x23:
              uVar7 = QString::toUInt((QString *)
                                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                      (bool *)other,iVar5);
              QVariant::QVariant(in_RDI,uVar7);
              break;
            case (QVariant *)0x2:
              qVar12 = QString::toLongLong((QString *)
                                           CONCAT44(in_stack_fffffffffffffd4c,
                                                    in_stack_fffffffffffffd48),(bool *)other,iVar5);
              QVariant::QVariant(in_RDI,qVar12);
              break;
            case (QVariant *)0x3:
              qVar13 = QString::toULongLong
                                 ((QString *)
                                  CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                  (bool *)other,iVar5);
              QVariant::QVariant(in_RDI,qVar13);
              break;
            case (QVariant *)0x4:
              local_48._16_8_ = 0xaaaaaaaaaaaaaaaa;
              uStack_30 = 0xaaaaaaaaaaaaaaaa;
              local_48.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
              local_48._8_8_ = 0xaaaaaaaaaaaaaaaa;
              QVariant::QVariant((QVariant *)0x10b953);
              local_1f9 = 0;
              dVar3 = (double)QString::toDouble((bool *)&local_150);
              uVar6 = QSqlResult::numericalPrecisionPolicy();
              this_00 = (QVariant *)(ulong)uVar6;
              switch(this_00) {
              case (QVariant *)0x0:
              default:
                QVariant::QVariant(&local_108,(QString *)&local_150);
                QVariant::operator=((QVariant *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    other);
                QVariant::~QVariant(&local_108);
                local_1f9 = 1;
                break;
              case (QVariant *)0x1:
                QVariant::QVariant(&local_88,dVar3);
                iVar5 = QVariant::toInt((bool *)&local_88);
                QVariant::QVariant(&local_68,iVar5);
                QVariant::operator=((QVariant *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    other);
                QVariant::~QVariant(&local_68);
                QVariant::~QVariant(&local_88);
                break;
              case (QVariant *)0x2:
                QVariant::QVariant(&local_c8,dVar3);
                lVar14 = QVariant::toLongLong((bool *)&local_c8);
                QVariant::QVariant(&local_a8,lVar14);
                QVariant::operator=((QVariant *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    other);
                QVariant::~QVariant(&local_a8);
                QVariant::~QVariant(&local_c8);
                break;
              case (QVariant *)0x4:
                QVariant::QVariant(&local_e8,dVar3);
                QVariant::operator=((QVariant *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    other);
                QVariant::~QVariant(&local_e8);
              }
              if ((local_1f9 & 1) == 0) {
                QVariant::QVariant((QVariant *)0x10bb18);
              }
              else {
                QVariant::QVariant(this_00,(QVariant *)0x10bb04);
              }
              QVariant::~QVariant((QVariant *)&local_48);
              break;
            case (QVariant *)0x8:
            default:
              QVariant::QVariant(in_RDI,(QString *)&local_150);
              break;
            case (QVariant *)0xa:
              local_218.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_218.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
              local_218.d.size = -0x5555555555555556;
              QByteArray::QByteArray((QByteArray *)0x10bbc9);
              if ((pQVar8->preparedQuery & 1U) == 0) {
                QByteArray::QByteArray(&local_248,pQVar8->row[(int)in_EDX],local_270);
                QByteArray::operator=((QByteArray *)other,(QByteArray *)in_stack_fffffffffffffd38);
                QByteArray::~QByteArray((QByteArray *)0x10bc62);
              }
              else {
                QByteArray::QByteArray(&local_230,f_00->outField,f_00->bufLength);
                QByteArray::operator=((QByteArray *)other,(QByteArray *)in_stack_fffffffffffffd38);
                QByteArray::~QByteArray((QByteArray *)0x10bc17);
              }
              QVariant::QVariant(in_RDI,&local_218);
              QByteArray::~QByteArray((QByteArray *)0x10bc89);
              break;
            case (QVariant *)0xc:
              qDateFromString((QString *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
              break;
            case (QVariant *)0xd:
              qTimeFromString((QString *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
              break;
            case (QVariant *)0xe:
              qDateTimeFromString((QString *)
                                  CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            }
          }
        }
      }
      else if ((f_00->nullIndicator & 1U) == 0) {
        bVar4 = qIsBitfield(f_00->myField->type);
        if (bVar4) {
          local_160 = qDecodeBitfield(f_00,f_00->outField);
          QVariant::fromValue<unsigned_long,_true>
                    ((unsigned_long *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48))
          ;
        }
        else {
          iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,
                                (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          bVar4 = qIsInteger(iVar5);
          if (bVar4) {
            local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
            local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
            local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
            local_10 = 0xaaaaaaaaaaaaaaaa;
            local_168 = (f_00->type).d_ptr;
            QVariant::QVariant((QVariant *)&local_28,(QMetaType)local_168,f_00->outField);
            iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,
                                  (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            if (iVar5 == 0x25) {
              uVar6 = QVariant::toUInt((bool *)local_28.data);
              QVariant::QVariant(in_RDI,uVar6);
            }
            else {
              iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,
                                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              if (iVar5 == 0x22) {
                iVar5 = QVariant::toInt((bool *)local_28.data);
                QVariant::QVariant(in_RDI,iVar5);
              }
              else {
                QVariant::QVariant((QVariant *)in_stack_fffffffffffffd38,(QVariant *)0x10b459);
              }
            }
            QVariant::~QVariant((QVariant *)&local_28);
          }
          else {
            bVar4 = qIsTimeOrDate(f_00->myField->type);
            if ((!bVar4) || (f_00->bufLength < 0x28)) {
              iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,
                                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              if (iVar5 != 0xc) {
                QString::fromUtf8((char *)utf8,(qsizetype)in_RDI);
                QString::operator=((QString *)in_stack_fffffffffffffd40,
                                   (QString *)in_stack_fffffffffffffd38);
                QString::~QString((QString *)0x10b704);
              }
              goto LAB_0010b831;
            }
            piVar1 = (int *)f_00->outField;
            local_170.jd = -0x5555555555555556;
            QDate::QDate((QDate *)in_stack_fffffffffffffd40);
            spec = (Initialization)((ulong)in_stack_fffffffffffffd38 >> 0x20);
            local_174.mds = 0xaaaaaaaa;
            QTime::QTime(&local_174);
            iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,spec);
            if (iVar5 != 0xf) {
              QDate::QDate(&local_180,*piVar1,piVar1[1],piVar1[2]);
              local_170.jd = local_180.jd;
            }
            iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,spec);
            if (iVar5 != 0xe) {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(piVar1 + 6);
              QTime::QTime(&local_184,piVar1[3],piVar1[4],piVar1[5],SUB164(auVar2 / ZEXT816(1000),0)
                          );
              local_174.mds = local_184.mds;
            }
            iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,spec);
            if (iVar5 == 0x10) {
              local_198 = local_170.jd;
              local_19c = local_174.mds;
              QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffd40,spec);
              QDateTime::QDateTime(local_190,local_198,local_19c,&local_1a8,1);
              QVariant::QVariant(in_RDI,local_190);
              QDateTime::~QDateTime(local_190);
              QTimeZone::~QTimeZone(&local_1a8);
            }
            else {
              iVar5 = QMetaType::id((QMetaType *)in_stack_fffffffffffffd40,spec);
              if (iVar5 == 0xe) {
                local_1b0 = local_170.jd;
                QVariant::QVariant(in_RDI,local_170);
              }
              else {
                local_1b4 = local_174.mds;
                QVariant::QVariant(in_RDI,(QTime *)(ulong)(uint)local_174.mds);
              }
            }
          }
        }
      }
      else {
        local_158 = (f_00->type).d_ptr;
        QVariant::QVariant(in_RDI,(QMetaType)local_158,(void *)0x0);
      }
      QString::~QString((QString *)0x10bcb4);
      goto LAB_0010bcb4;
    }
  }
  local_118 = 0xaaaaaaaaaaaaaaaa;
  local_110 = 0xaaaaaaaaaaaaaaaa;
  lcMysql();
  anon_unknown.dwarf_33943::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  while (bVar4 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_118), bVar4) {
    anon_unknown.dwarf_33943::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x10b1ca);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),(char *)in_stack_fffffffffffffd38,
               (char *)0x10b1e3);
    QMessageLogger::warning(local_138,"QMYSQLResult::data: column %d out of range",(ulong)in_EDX);
    local_110 = local_110 & 0xffffffffffffff00;
  }
  QVariant::QVariant((QVariant *)0x10b211);
LAB_0010bcb4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return utf8;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QMYSQLResult::data(int field)
{
    Q_D(QMYSQLResult);
    if (!isSelect() || field >= d->fields.size()) {
        qCWarning(lcMysql, "QMYSQLResult::data: column %d out of range", field);
        return QVariant();
    }

    if (!driver())
        return QVariant();

    my_ulonglong fieldLength = 0;
    const QMYSQLResultPrivate::QMyField &f = d->fields.at(field);
    QString val;
    if (d->preparedQuery) {
        if (f.nullIndicator)
            return QVariant(f.type);
        if (qIsBitfield(f.myField->type)) {
            return QVariant::fromValue(qDecodeBitfield(f, f.outField));
        } else if (qIsInteger(f.type.id())) {
            QVariant variant(f.type, f.outField);
            // we never want to return char variants here, see QTBUG-53397
            if (f.type.id() == QMetaType::UChar)
                return variant.toUInt();
            else if (f.type.id() == QMetaType::Char)
                return variant.toInt();
            return variant;
        } else if (qIsTimeOrDate(f.myField->type) && f.bufLength >= sizeof(QT_MYSQL_TIME)) {
            auto t = reinterpret_cast<const QT_MYSQL_TIME *>(f.outField);
            QDate date;
            QTime time;
            if (f.type.id() != QMetaType::QTime)
                date = QDate(t->year, t->month, t->day);
            if (f.type.id() != QMetaType::QDate)
                time = QTime(t->hour, t->minute, t->second, t->second_part / 1000);
            if (f.type.id() == QMetaType::QDateTime)
                return QDateTime(date, time, QTimeZone::UTC);
            else if (f.type.id() == QMetaType::QDate)
                return date;
            else
                return time;
        }

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(f.outField, f.bufLength);
    } else {
        if (d->row[field] == nullptr) {
            // NULL value
            return QVariant(f.type);
        }

        if (qIsBitfield(f.myField->type))
            return QVariant::fromValue(qDecodeBitfield(f, d->row[field]));

        fieldLength = mysql_fetch_lengths(d->result)[field];

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(d->row[field], fieldLength);
    }

    switch (f.type.id()) {
    case QMetaType::LongLong:
        return QVariant(val.toLongLong());
    case QMetaType::ULongLong:
        return QVariant(val.toULongLong());
    case QMetaType::Char:
    case QMetaType::Short:
    case QMetaType::Int:
        return QVariant(val.toInt());
    case QMetaType::UChar:
    case QMetaType::UShort:
    case QMetaType::UInt:
        return QVariant(val.toUInt());
    case QMetaType::Double: {
        QVariant v;
        bool ok=false;
        double dbl = val.toDouble(&ok);
        switch(numericalPrecisionPolicy()) {
            case QSql::LowPrecisionInt32:
                v=QVariant(dbl).toInt();
                break;
            case QSql::LowPrecisionInt64:
                v = QVariant(dbl).toLongLong();
                break;
            case QSql::LowPrecisionDouble:
                v = QVariant(dbl);
                break;
            case QSql::HighPrecision:
            default:
                v = val;
                ok = true;
                break;
        }
        if (ok)
            return v;
        return QVariant();
    }
    case QMetaType::QDate:
        return qDateFromString(val);
    case QMetaType::QTime:
        return qTimeFromString(val);
    case QMetaType::QDateTime:
        return qDateTimeFromString(val);
    case QMetaType::QByteArray: {

        QByteArray ba;
        if (d->preparedQuery) {
            ba = QByteArray(f.outField, f.bufLength);
        } else {
            ba = QByteArray(d->row[field], fieldLength);
        }
        return QVariant(ba);
    }
    case QMetaType::QString:
    default:
        return QVariant(val);
    }
    Q_UNREACHABLE();
}